

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompareDump.cpp
# Opt level: O0

void __thiscall comparer_context::EOFActual(comparer_context *this)

{
  compare_fails_exception *this_00;
  ostream *poVar1;
  char *msg;
  string local_1c8;
  stringstream local_198 [8];
  stringstream ss;
  ostream local_188 [376];
  comparer_context *local_10;
  comparer_context *this_local;
  
  local_10 = this;
  std::__cxx11::stringstream::stringstream(local_198);
  this_00 = (compare_fails_exception *)__cxa_allocate_exception(0x1010);
  poVar1 = std::operator<<(local_188,
                           "Unexpected EOF reading ACTUAL.\nCurrent position in scene hierarchy is "
                          );
  print_hierarchy_abi_cxx11_(&local_1c8,this);
  std::operator<<(poVar1,(string *)&local_1c8);
  std::__cxx11::stringstream::str();
  msg = (char *)std::__cxx11::string::c_str();
  compare_fails_exception::compare_fails_exception(this_00,msg);
  __cxa_throw(this_00,&compare_fails_exception::typeinfo,
              compare_fails_exception::~compare_fails_exception);
}

Assistant:

void EOFActual() {
        std::stringstream ss;
        throw compare_fails_exception((ss
            << "Unexpected EOF reading ACTUAL.\nCurrent position in scene hierarchy is "
            << print_hierarchy(),ss.str().c_str()
            ));
    }